

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

double __thiscall
deqp::gls::BuiltinPrecisionTests::Functions::LogFunc::precision
          (LogFunc *this,EvalContext *ctx,double ret,double x)

{
  Precision PVar1;
  float fVar2;
  LogFunc *local_48;
  LogFunc *local_40;
  double x_local;
  double ret_local;
  EvalContext *ctx_local;
  LogFunc *this_local;
  
  if (0.0 < x) {
    PVar1 = ctx->floatPrecision;
    if (PVar1 == PRECISION_LOWP) {
      this_local = (LogFunc *)tcu::FloatFormat::ulp(&ctx->format,ret,2.0);
    }
    else if (PVar1 == PRECISION_MEDIUMP) {
      if ((x < 0.5) || (2.0 < x)) {
        local_48 = (LogFunc *)tcu::FloatFormat::ulp(&ctx->format,ret,2.0);
      }
      else {
        local_48 = (LogFunc *)deLdExp(1.0,-7);
      }
      this_local = local_48;
    }
    else if (PVar1 == PRECISION_HIGHP) {
      if ((x < 0.5) || (2.0 < x)) {
        local_40 = (LogFunc *)tcu::FloatFormat::ulp(&ctx->format,ret,3.0);
      }
      else {
        local_40 = (LogFunc *)deLdExp(1.0,-0x15);
      }
      this_local = local_40;
    }
    else {
      this_local = (LogFunc *)0x0;
    }
  }
  else {
    fVar2 = std::numeric_limits<float>::quiet_NaN();
    this_local = (LogFunc *)(double)fVar2;
  }
  return (double)this_local;
}

Assistant:

double		precision	(const EvalContext& ctx, double ret, double x) const
	{
		if (x <= 0)
			return TCU_NAN;

		switch (ctx.floatPrecision)
		{
			case glu::PRECISION_HIGHP:
				return (0.5 <= x && x <= 2.0) ? deLdExp(1.0, -21) : ctx.format.ulp(ret, 3.0);
			case glu::PRECISION_MEDIUMP:
				return (0.5 <= x && x <= 2.0) ? deLdExp(1.0, -7) : ctx.format.ulp(ret, 2.0);
			case glu::PRECISION_LOWP:
				return ctx.format.ulp(ret, 2.0);
			default:
				DE_FATAL("Impossible");
		}

		return 0;
	}